

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

void free_attr_list(attr_list list)

{
  attr_p paVar1;
  attr_list *__ptr;
  short sVar2;
  void *__ptr_00;
  long lVar3;
  ulong uVar4;
  
  if ((list == (attr_list)0x0) || (sVar2 = list->ref_count + -1, list->ref_count = sVar2, 0 < sVar2)
     ) {
    return;
  }
  if (list->list_of_lists == 0) {
    if (((list->l).list.iattrs)->other_attr_count != '\0') {
      lVar3 = 0x10;
      uVar4 = 0;
      do {
        paVar1 = (list->l).list.attributes;
        switch(*(undefined4 *)((long)paVar1 + lVar3 + -0xc)) {
        case 0:
        case 1:
        case 2:
        case 5:
        case 7:
        case 8:
        case 9:
          break;
        case 3:
          __ptr_00 = *(void **)((long)paVar1 + lVar3 + -8);
LAB_00105d06:
          free(__ptr_00);
          break;
        case 4:
          __ptr_00 = *(void **)((long)&paVar1->attr_id + lVar3);
          if (__ptr_00 != (void *)0x0) goto LAB_00105d06;
          break;
        case 6:
          free_attr_list(*(attr_list *)((long)paVar1 + lVar3 + -8));
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x5e4,"void free_attr_list(attr_list)");
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < ((list->l).list.iattrs)->other_attr_count);
    }
    paVar1 = (list->l).list.attributes;
    if (paVar1 != (attr_p)0x0) {
      free(paVar1);
    }
    __ptr = (list->l).lists.lists;
    if (__ptr != (attr_list *)0x0) {
      free(__ptr);
      (list->l).lists.lists = (attr_list *)0x0;
    }
  }
  else {
    if (0 < (list->l).lists.sublist_count) {
      lVar3 = 0;
      do {
        free_attr_list((list->l).lists.lists[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (list->l).lists.sublist_count);
    }
    free((list->l).lists.lists);
  }
  free(list);
  return;
}

Assistant:

void
free_attr_list(attr_list list)
{
    if (list == NULL) return;
    list->ref_count--;
    if (list->ref_count > 0) return;
    if (list->list_of_lists) {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            free_attr_list(list->l.lists.lists[i]);
        }
        free(list->l.lists.lists);
        free(list);
    } else {
        int i;
        for (i=0; i< list->l.list.iattrs->other_attr_count; i++) {
            switch (list->l.list.attributes[i].val_type) {
            case Attr_Undefined:
            case Attr_Int4:
            case Attr_Int8:
	    case Attr_Float16:
	    case Attr_Float8:
	    case Attr_Float4:
                break;
            case Attr_Atom:
                break;
            case Attr_String:
                free((char *)list->l.list.attributes[i].value.u.p);
                break;
            case Attr_Opaque: {
                attr_opaque o = list->l.list.attributes[i].value.u.o;
                if (o.buffer) {
                    free(o.buffer);
                }
                break;
            }
            case Attr_List:
                free_attr_list((attr_list)list->l.list.attributes[i].value.u.p);
                break;                  
            default:
                assert(0);
            }
        }
        if (list->l.list.attributes != NULL) {
            free(list->l.list.attributes);
        }
	if (list->l.list.iattrs != NULL) {
	    free(list->l.list.iattrs);
	    list->l.list.iattrs = NULL;
	}
        free(list);
    }      
}